

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_info_ext_key_usage(char **buf,size_t *size,mbedtls_x509_sequence *extended_key_usage)

{
  int iVar1;
  char *local_58;
  char *sep;
  mbedtls_x509_sequence *cur;
  char *p;
  size_t n;
  char *desc;
  mbedtls_x509_sequence *pmStack_28;
  int ret;
  mbedtls_x509_sequence *extended_key_usage_local;
  size_t *size_local;
  char **buf_local;
  
  p = (char *)*size;
  cur = (mbedtls_x509_sequence *)*buf;
  local_58 = anon_var_dwarf_60c80 + 9;
  sep = (char *)extended_key_usage;
  pmStack_28 = extended_key_usage;
  extended_key_usage_local = (mbedtls_x509_sequence *)size;
  size_local = (size_t *)buf;
  while( true ) {
    if (sep == (char *)0x0) {
      *(char **)&extended_key_usage_local->buf = p;
      *size_local = (size_t)cur;
      return 0;
    }
    iVar1 = mbedtls_oid_get_extended_key_usage((mbedtls_asn1_buf *)sep,(char **)&n);
    if (iVar1 != 0) {
      n = (size_t)anon_var_dwarf_313d8;
    }
    desc._4_4_ = snprintf((char *)cur,(size_t)p,"%s%s",local_58,n);
    if ((desc._4_4_ < 0) || (p <= (char *)(long)desc._4_4_)) break;
    p = p + -(long)desc._4_4_;
    cur = (mbedtls_x509_sequence *)((long)&(cur->buf).tag + (long)desc._4_4_);
    local_58 = ", ";
    sep = *(char **)(sep + 0x18);
  }
  return -0x2980;
}

Assistant:

static int x509_info_ext_key_usage( char **buf, size_t *size,
                                    const mbedtls_x509_sequence *extended_key_usage )
{
    int ret;
    const char *desc;
    size_t n = *size;
    char *p = *buf;
    const mbedtls_x509_sequence *cur = extended_key_usage;
    const char *sep = "";

    while( cur != NULL )
    {
        if( mbedtls_oid_get_extended_key_usage( &cur->buf, &desc ) != 0 )
            desc = "???";

        ret = mbedtls_snprintf( p, n, "%s%s", sep, desc );
        MBEDTLS_X509_SAFE_SNPRINTF;

        sep = ", ";

        cur = cur->next;
    }

    *size = n;
    *buf = p;

    return( 0 );
}